

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void ts_parser__log(TSParser *self)

{
  _func_void_void_ptr_TSLogType_char_ptr *p_Var1;
  char *pcVar2;
  
  p_Var1 = (self->lexer).logger.log;
  if (p_Var1 != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) {
    (*p_Var1)((self->lexer).logger.payload,TSLogTypeParse,(self->lexer).debug_buffer);
  }
  if ((FILE *)self->dot_graph_file != (FILE *)0x0) {
    fwrite("graph {\nlabel=\"",0xf,1,(FILE *)self->dot_graph_file);
    pcVar2 = (self->lexer).debug_buffer;
    do {
      if (*pcVar2 == '\"') {
        fputc(0x5c,(FILE *)self->dot_graph_file);
      }
      else if (*pcVar2 == '\0') {
        fwrite("\"\n}\n\n",5,1,(FILE *)self->dot_graph_file);
        return;
      }
      fputc((int)*pcVar2,(FILE *)self->dot_graph_file);
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
  return;
}

Assistant:

static void ts_parser__log(TSParser *self) {
  if (self->lexer.logger.log) {
    self->lexer.logger.log(
      self->lexer.logger.payload,
      TSLogTypeParse,
      self->lexer.debug_buffer
    );
  }

  if (self->dot_graph_file) {
    fprintf(self->dot_graph_file, "graph {\nlabel=\"");
    for (char *c = &self->lexer.debug_buffer[0]; *c != 0; c++) {
      if (*c == '"') fputc('\\', self->dot_graph_file);
      fputc(*c, self->dot_graph_file);
    }
    fprintf(self->dot_graph_file, "\"\n}\n\n");
  }
}